

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::CacheEquals
               (SSL_CTX *ctx,vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *expected)

{
  SSL_SESSION **ppSVar1;
  pointer ppsVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  SSL_SESSION *pSVar6;
  ulong uVar7;
  pointer ppsVar8;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range2;
  void *pvVar9;
  bool bVar10;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> expected_copy;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> actual;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_68;
  void *local_48;
  void *pvStack_40;
  long local_38;
  code *local_28;
  void **local_20;
  
  pSVar6 = ctx->session_cache_head;
  ppsVar8 = (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppsVar2 = (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar8 != ppsVar2) {
    do {
      if (pSVar6 != *ppsVar8) goto LAB_00170275;
      ppSVar1 = &pSVar6->next;
      pSVar6 = *ppSVar1;
      if (*ppSVar1 == (SSL_SESSION *)&ctx->session_cache_tail) {
        pSVar6 = (SSL_SESSION *)0x0;
      }
      ppsVar8 = ppsVar8 + 1;
    } while (ppsVar8 != ppsVar2);
  }
  if (pSVar6 == (SSL_SESSION *)0x0) {
    local_20 = &local_48;
    local_48 = (void *)0x0;
    pvStack_40 = (void *)0x0;
    local_38 = 0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28 = AppendSession;
    OPENSSL_lh_doall_arg((_LHASH *)ctx->sessions,lh_SSL_SESSION_call_doall_arg,&local_28);
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::operator=(&local_68,expected);
    pvVar4 = pvStack_40;
    pvVar9 = local_48;
    if (local_48 != pvStack_40) {
      uVar7 = (long)pvStack_40 - (long)local_48 >> 3;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48,pvStack_40,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pvVar9,pvVar4);
    }
    ppsVar2 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppsVar8 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar7 = (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppsVar8,ppsVar2);
      ppsVar8 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    pvVar9 = local_48;
    ppsVar2 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((long)pvStack_40 - (long)local_48 ==
        (long)ppsVar8 -
        (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (pvStack_40 == local_48) {
        bVar10 = true;
      }
      else {
        iVar5 = bcmp(local_48,local_68.
                              super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                     (long)pvStack_40 - (long)local_48);
        bVar10 = iVar5 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    if (ppsVar2 != (pointer)0x0) {
      operator_delete(ppsVar2,(long)local_68.
                                    super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppsVar2);
      pvVar9 = local_48;
    }
    if (pvVar9 != (void *)0x0) {
      operator_delete(pvVar9,local_38 - (long)pvVar9);
    }
  }
  else {
LAB_00170275:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool CacheEquals(SSL_CTX *ctx,
                        const std::vector<SSL_SESSION *> &expected) {
  // Check the linked list.
  SSL_SESSION *ptr = ctx->session_cache_head;
  for (SSL_SESSION *session : expected) {
    if (ptr != session) {
      return false;
    }
    // TODO(davidben): This is an absurd way to denote the end of the list.
    if (ptr->next ==
        reinterpret_cast<SSL_SESSION *>(&ctx->session_cache_tail)) {
      ptr = nullptr;
    } else {
      ptr = ptr->next;
    }
  }
  if (ptr != nullptr) {
    return false;
  }

  // Check the hash table.
  std::vector<SSL_SESSION *> actual, expected_copy;
  lh_SSL_SESSION_doall_arg(ctx->sessions, AppendSession, &actual);
  expected_copy = expected;

  std::sort(actual.begin(), actual.end());
  std::sort(expected_copy.begin(), expected_copy.end());

  return actual == expected_copy;
}